

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_format.h
# Opt level: O1

string * ST::format<unsigned_char>(string *__return_storage_ptr__,char *fmt_str,uchar *args)

{
  string_format_writer data;
  format_writer local_148;
  char *local_138;
  ulong local_130;
  size_t local_128;
  char local_120 [256];
  
  format_writer::format_writer(&local_148,fmt_str);
  local_148._vptr_format_writer = (_func_int **)&PTR__string_format_writer_002a3700;
  local_138 = local_120;
  local_130 = 0x100;
  local_128 = 0;
  apply_format<unsigned_char>(&local_148,args);
  string::from_utf8(__return_storage_ptr__,local_138,local_128,check_validity);
  local_148._vptr_format_writer = (_func_int **)&PTR__string_format_writer_002a3700;
  if ((0x100 < local_130) && (local_138 != (char *)0x0)) {
    operator_delete__(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

ST_NODISCARD
    string format(const char *fmt_str, args_T &&...args)
    {
        _ST_PRIVATE::string_format_writer data(fmt_str);
        apply_format(data, std::forward<args_T>(args)...);
        return data.to_string(true, ST_DEFAULT_VALIDATION);
    }